

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_overlay.cpp
# Opt level: O0

void __thiscall
r_exec::InputLessPGMOverlay::patch_tpl_code
          (InputLessPGMOverlay *this,uint16_t pgm_code_index,uint16_t ipgm_code_index)

{
  byte bVar1;
  char cVar2;
  uint16_t pgm_code_index_00;
  uint16_t ipgm_code_index_00;
  Code *pCVar3;
  Atom local_1c [4];
  ushort local_18;
  ushort local_16;
  uint16_t local_14;
  uint16_t local_12;
  uint16_t j;
  uint16_t atom_count;
  uint16_t ipgm_code_index_local;
  uint16_t pgm_code_index_local;
  InputLessPGMOverlay *this_local;
  
  local_14 = ipgm_code_index;
  local_12 = pgm_code_index;
  _j = this;
  bVar1 = r_code::Atom::getAtomCount();
  local_16 = (ushort)bVar1;
  local_18 = 1;
  do {
    if (local_16 < local_18) {
      return;
    }
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x7e) {
      r_code::Atom::IPGMPointer((ushort)local_1c);
      r_code::Atom::operator=
                ((this->super_Overlay).code + (ulong)((uint)local_12 + (uint)local_18) * 4,local_1c)
      ;
      r_code::Atom::~Atom(local_1c);
    }
    else {
      if (cVar2 == -0x7d) {
        return;
      }
      if (cVar2 == -0x7c) {
        pgm_code_index_00 = r_code::Atom::asIndex();
        pCVar3 = Overlay::getObject(&this->super_Overlay);
        (*(pCVar3->super__Object)._vptr__Object[4])(pCVar3,(ulong)(ushort)(local_14 + local_18));
        ipgm_code_index_00 = r_code::Atom::asIndex();
        patch_tpl_code(this,pgm_code_index_00,ipgm_code_index_00);
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void InputLessPGMOverlay::patch_tpl_code(uint16_t pgm_code_index, uint16_t ipgm_code_index)   // patch recursively : in pgm_code[index] with IPGM_PTRs until ::.
{
    uint16_t atom_count = code[pgm_code_index].getAtomCount();

    for (uint16_t j = 1; j <= atom_count; ++j) {
        switch (code[pgm_code_index + j].getDescriptor()) {
        case Atom::WILDCARD:
            code[pgm_code_index + j] = Atom::IPGMPointer(ipgm_code_index + j);
            break;

        case Atom::T_WILDCARD: // leave as is and stop patching.
            return;

        case Atom::I_PTR:
            patch_tpl_code(code[pgm_code_index + j].asIndex(), getObject()->code(ipgm_code_index + j).asIndex());
            break;

        default: // leave as is.
            break;
        }
    }
}